

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O0

int64_t __thiscall
libtorrent::anon_unknown_40::compute_total_size
          (anon_unknown_40 *this,span<const_libtorrent::create_file_entry> files)

{
  long lVar1;
  error_code local_50;
  create_file_entry *local_40;
  create_file_entry *f;
  create_file_entry *__end2;
  create_file_entry *__begin2;
  span<const_libtorrent::create_file_entry> *__range2;
  int64_t ret;
  span<const_libtorrent::create_file_entry> files_local;
  
  files_local.m_ptr = files.m_ptr;
  __range2 = (span<const_libtorrent::create_file_entry> *)0x0;
  __begin2 = (create_file_entry *)&ret;
  ret = (int64_t)this;
  __end2 = span<const_libtorrent::create_file_entry>::begin
                     ((span<const_libtorrent::create_file_entry> *)__begin2);
  f = span<const_libtorrent::create_file_entry>::end
                ((span<const_libtorrent::create_file_entry> *)__begin2);
  while( true ) {
    if (__end2 == f) {
      return (int64_t)__range2;
    }
    local_40 = __end2;
    lVar1 = ::std::numeric_limits<long>::max();
    if (lVar1 - (long)__range2 < local_40->size) break;
    __range2 = (span<const_libtorrent::create_file_entry> *)
               ((long)&__range2->m_ptr + local_40->size);
    __end2 = __end2 + 1;
  }
  local_50 = boost::system::errc::make_error_code(file_too_large);
  libtorrent::aux::throw_ex<boost::system::system_error,boost::system::error_code>(&local_50);
}

Assistant:

std::int64_t compute_total_size(span<create_file_entry const> files)
	{
		std::int64_t ret = 0;
		for (auto const& f : files)
		{
			if (std::numeric_limits<std::int64_t>::max() - ret < f.size)
				aux::throw_ex<system_error>(make_error_code(
					boost::system::errc::file_too_large));
			ret += f.size;
		}
		return ret;
	}